

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upsampling.c
# Opt level: O3

void UpsampleRgba4444LinePair_C
               (uint8_t *top_y,uint8_t *bottom_y,uint8_t *top_u,uint8_t *top_v,uint8_t *cur_u,
               uint8_t *cur_v,uint8_t *top_dst,uint8_t *bottom_dst,int len)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  
  lVar17 = (long)len - 1;
  uVar3 = (int)lVar17 >> 1;
  uVar18 = (uint)*top_v << 0x10 | (uint)*top_u;
  uVar19 = (uint)*cur_v << 0x10 | (uint)*cur_u;
  uVar14 = uVar18 * 3 + uVar19 + 0x20002;
  uVar15 = uVar14 >> 0x12;
  uVar11 = (uint)*top_y * 0x4a85 >> 8;
  uVar5 = (uVar15 * 0x6625 >> 8) + uVar11;
  bVar4 = 0;
  uVar6 = uVar5 - 0x379a;
  bVar2 = 0xf0;
  if (uVar5 < 0x379a) {
    bVar2 = bVar4;
  }
  bVar10 = (byte)(uVar6 >> 6);
  if (0x3fff < uVar6) {
    bVar10 = bVar2;
  }
  uVar6 = uVar14 >> 2 & 0xff;
  iVar16 = (uVar15 * 0x3408 >> 8) + (uVar6 * 0x1913 >> 8);
  uVar5 = (uVar11 - iVar16) + 0x2204;
  bVar2 = 0xf;
  if ((int)(uVar11 - iVar16) < -0x2204) {
    bVar2 = bVar4;
  }
  if (uVar5 < 0x4000) {
    bVar2 = (byte)(uVar5 >> 10);
  }
  uVar11 = (uVar6 * 0x811a >> 8) + uVar11;
  uVar5 = uVar11 - 0x4515;
  *top_dst = bVar10 & 0xf0 | bVar2;
  bVar2 = (uVar11 < 0x4515) * '\x10' - 0x10;
  if (uVar5 < 0x4000) {
    bVar2 = (byte)(uVar5 >> 6);
  }
  top_dst[1] = bVar2 | 0xf;
  if (bottom_y != (uint8_t *)0x0) {
    uVar14 = uVar18 + uVar19 * 3 + 0x20002;
    uVar15 = uVar14 >> 0x12;
    uVar5 = (uint)*bottom_y * 0x4a85 >> 8;
    uVar6 = (uVar15 * 0x6625 >> 8) + uVar5;
    uVar11 = uVar6 - 0x379a;
    bVar2 = 0xf0;
    if (uVar6 < 0x379a) {
      bVar2 = bVar4;
    }
    bVar10 = (byte)(uVar11 >> 6);
    if (0x3fff < uVar11) {
      bVar10 = bVar2;
    }
    uVar6 = uVar14 >> 2 & 0xff;
    iVar16 = (uVar15 * 0x3408 >> 8) + (uVar6 * 0x1913 >> 8);
    uVar11 = (uVar5 - iVar16) + 0x2204;
    bVar2 = 0xf;
    if ((int)(uVar5 - iVar16) < -0x2204) {
      bVar2 = bVar4;
    }
    if (uVar11 < 0x4000) {
      bVar2 = (byte)(uVar11 >> 10);
    }
    uVar5 = (uVar6 * 0x811a >> 8) + uVar5;
    uVar6 = uVar5 - 0x4515;
    *bottom_dst = bVar10 & 0xf0 | bVar2;
    bVar2 = (uVar5 < 0x4515) * '\x10' - 0x10;
    if (uVar6 < 0x4000) {
      bVar2 = (byte)(uVar6 >> 6);
    }
    bottom_dst[1] = bVar2 | 0xf;
  }
  if (0 < (int)uVar3) {
    uVar20 = 0;
    uVar5 = uVar19;
    uVar6 = uVar18;
    do {
      uVar18 = (uint)top_v[uVar20 + 1] << 0x10 | (uint)top_u[uVar20 + 1];
      uVar19 = (uint)cur_v[uVar20 + 1] << 0x10 | (uint)cur_u[uVar20 + 1];
      iVar16 = uVar5 + uVar6 + uVar18 + uVar19;
      uVar21 = iVar16 + (uVar18 + uVar5) * 2 + 0x80008 >> 3;
      uVar9 = iVar16 + (uVar19 + uVar6) * 2 + 0x80008 >> 3;
      uVar6 = uVar6 + uVar21;
      uVar7 = uVar18 + uVar9;
      uVar12 = uVar6 >> 1 & 0xff;
      uVar6 = uVar6 >> 0x11;
      uVar11 = (uint)top_y[uVar20 * 2 + 1] * 0x4a85 >> 8;
      uVar14 = (uVar6 * 0x6625 >> 8) + uVar11;
      uVar15 = uVar14 - 0x379a;
      bVar2 = 0xf0;
      if (uVar14 < 0x379a) {
        bVar2 = 0;
      }
      bVar4 = (byte)(uVar15 >> 6);
      if (0x3fff < uVar15) {
        bVar4 = bVar2;
      }
      iVar16 = uVar11 - ((uVar6 * 0x3408 >> 8) + (uVar12 * 0x1913 >> 8));
      uVar6 = iVar16 + 0x2204;
      bVar2 = 0xf;
      if (iVar16 < -0x2204) {
        bVar2 = 0;
      }
      if (uVar6 < 0x4000) {
        bVar2 = (byte)(uVar6 >> 10);
      }
      uVar11 = (uVar12 * 0x811a >> 8) + uVar11;
      uVar6 = uVar11 - 0x4515;
      bVar13 = 0xf0;
      bVar10 = (uVar11 < 0x4515) * '\x10' - 0x10;
      if (uVar6 < 0x4000) {
        bVar10 = (byte)(uVar6 >> 6);
      }
      uVar6 = uVar7 >> 1 & 0xff;
      uVar7 = uVar7 >> 0x11;
      uVar11 = (uint)top_y[uVar20 * 2 + 2] * 0x4a85 >> 8;
      uVar14 = (uVar7 * 0x6625 >> 8) + uVar11;
      uVar15 = uVar14 - 0x379a;
      if (uVar14 < 0x379a) {
        bVar13 = 0;
      }
      bVar1 = (byte)(uVar15 >> 6);
      if (0x3fff < uVar15) {
        bVar1 = bVar13;
      }
      iVar16 = uVar11 - ((uVar7 * 0x3408 >> 8) + (uVar6 * 0x1913 >> 8));
      uVar14 = iVar16 + 0x2204;
      bVar13 = 0xf;
      if (iVar16 < -0x2204) {
        bVar13 = 0;
      }
      top_dst[uVar20 * 4 + 2] = bVar4 & 0xf0 | bVar2;
      if (uVar14 < 0x4000) {
        bVar13 = (byte)(uVar14 >> 10);
      }
      top_dst[uVar20 * 4 + 3] = bVar10 | 0xf;
      uVar11 = (uVar6 * 0x811a >> 8) + uVar11;
      uVar6 = uVar11 - 0x4515;
      bVar2 = (uVar11 < 0x4515) * '\x10' - 0x10;
      if (uVar6 < 0x4000) {
        bVar2 = (byte)(uVar6 >> 6);
      }
      top_dst[uVar20 * 4 + 4] = bVar1 & 0xf0 | bVar13;
      top_dst[uVar20 * 4 + 5] = bVar2 | 0xf;
      if (bottom_y != (uint8_t *)0x0) {
        uVar9 = uVar9 + uVar5;
        uVar21 = uVar21 + uVar19;
        uVar14 = uVar9 >> 1 & 0xff;
        uVar9 = uVar9 >> 0x11;
        uVar5 = (uint)bottom_y[uVar20 * 2 + 1] * 0x4a85 >> 8;
        uVar6 = (uVar9 * 0x6625 >> 8) + uVar5;
        uVar11 = uVar6 - 0x379a;
        bVar2 = 0xf0;
        if (uVar6 < 0x379a) {
          bVar2 = 0;
        }
        bVar4 = (byte)(uVar11 >> 6);
        if (0x3fff < uVar11) {
          bVar4 = bVar2;
        }
        iVar16 = uVar5 - ((uVar9 * 0x3408 >> 8) + (uVar14 * 0x1913 >> 8));
        uVar6 = iVar16 + 0x2204;
        bVar2 = 0xf;
        if (iVar16 < -0x2204) {
          bVar2 = 0;
        }
        if (uVar6 < 0x4000) {
          bVar2 = (byte)(uVar6 >> 10);
        }
        uVar5 = (uVar14 * 0x811a >> 8) + uVar5;
        uVar6 = uVar5 - 0x4515;
        bottom_dst[uVar20 * 4 + 2] = bVar4 & 0xf0 | bVar2;
        bVar2 = (uVar5 < 0x4515) * '\x10' - 0x10;
        if (uVar6 < 0x4000) {
          bVar2 = (byte)(uVar6 >> 6);
        }
        uVar5 = uVar21 >> 1 & 0xff;
        uVar21 = uVar21 >> 0x11;
        uVar6 = (uint)bottom_y[uVar20 * 2 + 2] * 0x4a85 >> 8;
        uVar11 = (uVar21 * 0x6625 >> 8) + uVar6;
        uVar14 = uVar11 - 0x379a;
        bVar4 = 0xf0;
        if (uVar11 < 0x379a) {
          bVar4 = 0;
        }
        bVar10 = (byte)(uVar14 >> 6);
        if (0x3fff < uVar14) {
          bVar10 = bVar4;
        }
        bottom_dst[uVar20 * 4 + 3] = bVar2 | 0xf;
        iVar16 = uVar6 - ((uVar21 * 0x3408 >> 8) + (uVar5 * 0x1913 >> 8));
        uVar11 = iVar16 + 0x2204;
        bVar2 = 0xf;
        if (iVar16 < -0x2204) {
          bVar2 = 0;
        }
        if (uVar11 < 0x4000) {
          bVar2 = (byte)(uVar11 >> 10);
        }
        uVar6 = (uVar5 * 0x811a >> 8) + uVar6;
        uVar5 = uVar6 - 0x4515;
        bottom_dst[uVar20 * 4 + 4] = bVar10 & 0xf0 | bVar2;
        bVar2 = (uVar6 < 0x4515) * '\x10' - 0x10;
        if (uVar5 < 0x4000) {
          bVar2 = (byte)(uVar5 >> 6);
        }
        bottom_dst[uVar20 * 4 + 5] = bVar2 | 0xf;
      }
      uVar20 = uVar20 + 1;
      uVar5 = uVar19;
      uVar6 = uVar18;
    } while (uVar3 != uVar20);
  }
  if (((long)len & 1U) == 0) {
    uVar3 = uVar19 + uVar18 * 3 + 0x20002;
    uVar14 = uVar3 >> 2 & 0xff;
    uVar3 = uVar3 >> 0x12;
    uVar5 = (uint)top_y[lVar17] * 0x4a85 >> 8;
    uVar6 = (uVar3 * 0x6625 >> 8) + uVar5;
    bVar4 = 0;
    uVar11 = uVar6 - 0x379a;
    bVar2 = 0xf0;
    if (uVar6 < 0x379a) {
      bVar2 = bVar4;
    }
    bVar10 = (byte)(uVar11 >> 6);
    if (0x3fff < uVar11) {
      bVar10 = bVar2;
    }
    iVar16 = (uVar3 * 0x3408 >> 8) + (uVar14 * 0x1913 >> 8);
    uVar3 = (uVar5 - iVar16) + 0x2204;
    bVar2 = 0xf;
    if ((int)(uVar5 - iVar16) < -0x2204) {
      bVar2 = bVar4;
    }
    if (uVar3 < 0x4000) {
      bVar2 = (byte)(uVar3 >> 10);
    }
    uVar5 = (uVar14 * 0x811a >> 8) + uVar5;
    uVar3 = uVar5 - 0x4515;
    bVar13 = (uVar5 < 0x4515) * '\x10' - 0x10;
    if (uVar3 < 0x4000) {
      bVar13 = (byte)(uVar3 >> 6);
    }
    lVar8 = (long)(int)lVar17;
    top_dst[lVar8 * 2] = bVar10 & 0xf0 | bVar2;
    top_dst[lVar8 * 2 + 1] = bVar13 | 0xf;
    if (bottom_y != (uint8_t *)0x0) {
      uVar18 = uVar18 + uVar19 * 3 + 0x20002;
      uVar11 = uVar18 >> 0x12;
      uVar3 = (uint)bottom_y[lVar17] * 0x4a85 >> 8;
      uVar5 = (uVar11 * 0x6625 >> 8) + uVar3;
      uVar6 = uVar5 - 0x379a;
      bVar2 = 0xf0;
      if (uVar5 < 0x379a) {
        bVar2 = bVar4;
      }
      bVar10 = (byte)(uVar6 >> 6);
      if (0x3fff < uVar6) {
        bVar10 = bVar2;
      }
      uVar5 = uVar18 >> 2 & 0xff;
      iVar16 = (uVar11 * 0x3408 >> 8) + (uVar5 * 0x1913 >> 8);
      uVar6 = (uVar3 - iVar16) + 0x2204;
      bVar2 = 0xf;
      if ((int)(uVar3 - iVar16) < -0x2204) {
        bVar2 = bVar4;
      }
      if (uVar6 < 0x4000) {
        bVar2 = (byte)(uVar6 >> 10);
      }
      uVar3 = (uVar5 * 0x811a >> 8) + uVar3;
      uVar5 = uVar3 - 0x4515;
      bottom_dst[lVar8 * 2] = bVar10 & 0xf0 | bVar2;
      bVar2 = (uVar3 < 0x4515) * '\x10' - 0x10;
      if (uVar5 < 0x4000) {
        bVar2 = (byte)(uVar5 >> 6);
      }
      bottom_dst[lVar8 * 2 + 1] = bVar2 | 0xf;
    }
  }
  return;
}

Assistant:

static void EmptyUpsampleFunc(const uint8_t* top_y, const uint8_t* bottom_y,
                              const uint8_t* top_u, const uint8_t* top_v,
                              const uint8_t* cur_u, const uint8_t* cur_v,
                              uint8_t* top_dst, uint8_t* bottom_dst, int len) {
  (void)top_y;
  (void)bottom_y;
  (void)top_u;
  (void)top_v;
  (void)cur_u;
  (void)cur_v;
  (void)top_dst;
  (void)bottom_dst;
  (void)len;
  assert(0);   // COLORSPACE SUPPORT NOT COMPILED
}